

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O0

bool __thiscall search::BSTree::find(BSTree *this,int key,Record **r)

{
  BSTNode *pBVar1;
  BSTNode *ret;
  Record **r_local;
  int key_local;
  BSTree *this_local;
  
  if (this->root_ == (BSTNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pBVar1 = BSTNode::search(this->root_,key);
    if (pBVar1 == (BSTNode *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      *r = pBVar1;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BSTree::find(int key, Record*& r)
    {
        if (!root_)
            return false;
        auto ret =  root_->search(key);
        if (ret)
        {
            r = ret;
            return true;
        }
        else
            return false;
    }